

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loslib.c
# Opt level: O3

int os_time(lua_State *L)

{
  int iVar1;
  int iVar2;
  time_t n;
  tm ts;
  tm local_58;
  
  iVar1 = lua_type(L,1);
  if (iVar1 < 1) {
    n = time((time_t *)0x0);
  }
  else {
    luaL_checktype(L,1,5);
    lua_settop(L,1);
    local_58.tm_sec = getfield(L,"sec",0,0);
    local_58.tm_min = getfield(L,"min",0,0);
    local_58.tm_hour = getfield(L,"hour",0xc,0);
    iVar2 = -1;
    local_58.tm_mday = getfield(L,"day",-1,0);
    local_58.tm_mon = getfield(L,"month",-1,1);
    local_58.tm_year = getfield(L,"year",-1,0x76c);
    iVar1 = lua_getfield(L,-1,"isdst");
    if (iVar1 != 0) {
      iVar2 = lua_toboolean(L,-1);
    }
    lua_settop(L,-2);
    local_58.tm_isdst = iVar2;
    n = mktime((tm *)&local_58);
    setallfields(L,&local_58);
  }
  if (n == -1) {
    luaL_error(L,"time result cannot be represented in this installation");
  }
  lua_pushinteger(L,n);
  return 1;
}

Assistant:

static int os_time(lua_State *L) {
    time_t t;
    if (lua_isnoneornil(L, 1))  /* called without args? */
        t = time(NULL);  /* get current time */
    else {
        struct tm ts;
        luaL_checktype(L, 1, LUA_TTABLE);
        lua_settop(L, 1);  /* make sure table is at the top */
        ts.tm_sec = getfield(L, "sec", 0, 0);
        ts.tm_min = getfield(L, "min", 0, 0);
        ts.tm_hour = getfield(L, "hour", 12, 0);
        ts.tm_mday = getfield(L, "day", -1, 0);
        ts.tm_mon = getfield(L, "month", -1, 1);
        ts.tm_year = getfield(L, "year", -1, 1900);
        ts.tm_isdst = getboolfield(L, "isdst");
        t = mktime(&ts);
        setallfields(L, &ts);  /* update fields with normalized values */
    }
    if (t != (time_t) (l_timet) t || t == (time_t) (-1))
        luaL_error(L, "time result cannot be represented in this installation");
    l_pushtime(L, t);
    return 1;
}